

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docio.cc
# Opt level: O0

fdb_status docio_read_doc_key(docio_handle *handle,uint64_t offset,keylen_t *keylen,void *keybuf)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  docio_length length_00;
  undefined8 uVar7;
  ushort *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  byte bVar21;
  docio_length dVar22;
  err_log_callback *log_callback;
  docio_length zero_length;
  docio_length _length;
  docio_length length;
  int64_t _offset;
  uint8_t checksum;
  undefined8 in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  undefined4 uVar23;
  undefined8 in_stack_ffffffffffffff00;
  undefined4 uVar24;
  undefined8 in_stack_ffffffffffffff20;
  undefined4 uVar25;
  docio_length local_c0;
  undefined8 in_stack_ffffffffffffff50;
  undefined1 read_on_cache_miss;
  err_log_callback *in_stack_ffffffffffffff58;
  err_log_callback *log_callback_00;
  err_log_callback *log_callback_01;
  char in_stack_ffffffffffffff68;
  char in_stack_ffffffffffffff69;
  char in_stack_ffffffffffffff6a;
  char in_stack_ffffffffffffff6b;
  char in_stack_ffffffffffffff6c;
  char in_stack_ffffffffffffff6d;
  char in_stack_ffffffffffffff6e;
  char in_stack_ffffffffffffff6f;
  char in_stack_ffffffffffffff70;
  char in_stack_ffffffffffffff71;
  char in_stack_ffffffffffffff72;
  char in_stack_ffffffffffffff73;
  uint8_t in_stack_ffffffffffffff74;
  byte in_stack_ffffffffffffff75;
  char in_stack_ffffffffffffff76;
  char in_stack_ffffffffffffff77;
  char in_stack_ffffffffffffff78;
  char in_stack_ffffffffffffff79;
  char in_stack_ffffffffffffff7a;
  char in_stack_ffffffffffffff7b;
  char in_stack_ffffffffffffff7c;
  char in_stack_ffffffffffffff7d;
  char in_stack_ffffffffffffff7e;
  char in_stack_ffffffffffffff7f;
  char cStack_80;
  char cStack_7f;
  char cStack_7e;
  char cStack_7d;
  uint8_t uStack_7c;
  byte bStack_7b;
  char cStack_7a;
  char cStack_79;
  docio_length local_78;
  fdb_status local_68;
  byte local_59;
  ushort *local_50;
  undefined8 local_48;
  undefined8 *local_40;
  fdb_status local_34;
  
  uVar23 = (undefined4)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  uVar24 = (undefined4)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  uVar25 = (undefined4)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  read_on_cache_miss = (undefined1)((ulong)in_stack_ffffffffffffff50 >> 0x38);
  local_50 = in_RDX;
  local_48 = in_RSI;
  local_40 = in_RDI;
  docio_length::docio_length(&local_78);
  docio_length::docio_length((docio_length *)&stack0xffffffffffffff78);
  docio_length::docio_length((docio_length *)&stack0xffffffffffffff68);
  log_callback_01 = (err_log_callback *)local_40[6];
  _local_68 = (fdb_status)
              _docio_read_length((docio_handle *)
                                 CONCAT17(in_stack_ffffffffffffff77,
                                          CONCAT16(in_stack_ffffffffffffff76,
                                                   CONCAT15(in_stack_ffffffffffffff75,
                                                            CONCAT14(in_stack_ffffffffffffff74,
                                                                     CONCAT13(
                                                  in_stack_ffffffffffffff73,
                                                  CONCAT12(in_stack_ffffffffffffff72,
                                                           CONCAT11(in_stack_ffffffffffffff71,
                                                                    in_stack_ffffffffffffff70)))))))
                                 ,CONCAT17(in_stack_ffffffffffffff6f,
                                           CONCAT16(in_stack_ffffffffffffff6e,
                                                    CONCAT15(in_stack_ffffffffffffff6d,
                                                             CONCAT14(in_stack_ffffffffffffff6c,
                                                                      CONCAT13(
                                                  in_stack_ffffffffffffff6b,
                                                  CONCAT12(in_stack_ffffffffffffff6a,
                                                           CONCAT11(in_stack_ffffffffffffff69,
                                                                    in_stack_ffffffffffffff68)))))))
                                 ,(docio_length *)log_callback_01,in_stack_ffffffffffffff58,
                                 (bool)read_on_cache_miss);
  if ((long)_local_68 < 0) {
    fdb_log_impl(log_callback_01,2,(fdb_status)((ulong)_local_68 & 0xffffffff),
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                 ,"docio_read_doc_key",0x40c,
                 "Error in reading the doc length metadata with offset %lu from a database file \'%s\'"
                 ,local_48,*(undefined8 *)*local_40);
    local_34 = (fdb_status)_local_68;
  }
  else {
    memset(&stack0xffffffffffffff68,0,0x10);
    cVar8 = -(in_stack_ffffffffffffff7a == in_stack_ffffffffffffff6a);
    cVar9 = -(in_stack_ffffffffffffff7b == in_stack_ffffffffffffff6b);
    cVar10 = -(in_stack_ffffffffffffff7c == in_stack_ffffffffffffff6c);
    cVar11 = -(in_stack_ffffffffffffff7d == in_stack_ffffffffffffff6d);
    cVar12 = -(in_stack_ffffffffffffff7e == in_stack_ffffffffffffff6e);
    cVar13 = -(in_stack_ffffffffffffff7f == in_stack_ffffffffffffff6f);
    cVar14 = -(cStack_80 == in_stack_ffffffffffffff70);
    cVar15 = -(cStack_7f == in_stack_ffffffffffffff71);
    cVar16 = -(cStack_7e == in_stack_ffffffffffffff72);
    cVar17 = -(cStack_7d == in_stack_ffffffffffffff73);
    cVar18 = -(uStack_7c == in_stack_ffffffffffffff74);
    cVar19 = -(bStack_7b == in_stack_ffffffffffffff75);
    cVar20 = -(cStack_7a == in_stack_ffffffffffffff76);
    bVar21 = -(cStack_79 == in_stack_ffffffffffffff77);
    auVar1[1] = -(in_stack_ffffffffffffff79 == in_stack_ffffffffffffff69);
    auVar1[0] = -(in_stack_ffffffffffffff78 == in_stack_ffffffffffffff68);
    auVar1[2] = cVar8;
    auVar1[3] = cVar9;
    auVar1[4] = cVar10;
    auVar1[5] = cVar11;
    auVar1[6] = cVar12;
    auVar1[7] = cVar13;
    auVar1[8] = cVar14;
    auVar1[9] = cVar15;
    auVar1[10] = cVar16;
    auVar1[0xb] = cVar17;
    auVar1[0xc] = cVar18;
    auVar1[0xd] = cVar19;
    auVar1[0xe] = cVar20;
    auVar1[0xf] = bVar21;
    auVar2[1] = -(in_stack_ffffffffffffff79 == in_stack_ffffffffffffff69);
    auVar2[0] = -(in_stack_ffffffffffffff78 == in_stack_ffffffffffffff68);
    auVar2[2] = cVar8;
    auVar2[3] = cVar9;
    auVar2[4] = cVar10;
    auVar2[5] = cVar11;
    auVar2[6] = cVar12;
    auVar2[7] = cVar13;
    auVar2[8] = cVar14;
    auVar2[9] = cVar15;
    auVar2[10] = cVar16;
    auVar2[0xb] = cVar17;
    auVar2[0xc] = cVar18;
    auVar2[0xd] = cVar19;
    auVar2[0xe] = cVar20;
    auVar2[0xf] = bVar21;
    auVar6[1] = cVar9;
    auVar6[0] = cVar8;
    auVar6[2] = cVar10;
    auVar6[3] = cVar11;
    auVar6[4] = cVar12;
    auVar6[5] = cVar13;
    auVar6[6] = cVar14;
    auVar6[7] = cVar15;
    auVar6[8] = cVar16;
    auVar6[9] = cVar17;
    auVar6[10] = cVar18;
    auVar6[0xb] = cVar19;
    auVar6[0xc] = cVar20;
    auVar6[0xd] = bVar21;
    auVar5[1] = cVar10;
    auVar5[0] = cVar9;
    auVar5[2] = cVar11;
    auVar5[3] = cVar12;
    auVar5[4] = cVar13;
    auVar5[5] = cVar14;
    auVar5[6] = cVar15;
    auVar5[7] = cVar16;
    auVar5[8] = cVar17;
    auVar5[9] = cVar18;
    auVar5[10] = cVar19;
    auVar5[0xb] = cVar20;
    auVar5[0xc] = bVar21;
    auVar4[1] = cVar11;
    auVar4[0] = cVar10;
    auVar4[2] = cVar12;
    auVar4[3] = cVar13;
    auVar4[4] = cVar14;
    auVar4[5] = cVar15;
    auVar4[6] = cVar16;
    auVar4[7] = cVar17;
    auVar4[8] = cVar18;
    auVar4[9] = cVar19;
    auVar4[10] = cVar20;
    auVar4[0xb] = bVar21;
    auVar3[1] = cVar12;
    auVar3[0] = cVar11;
    auVar3[2] = cVar13;
    auVar3[3] = cVar14;
    auVar3[4] = cVar15;
    auVar3[5] = cVar16;
    auVar3[6] = cVar17;
    auVar3[7] = cVar18;
    auVar3[8] = cVar19;
    auVar3[9] = cVar20;
    auVar3[10] = bVar21;
    if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 | (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3
                 | (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                 (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                 (ushort)((byte)(CONCAT19(bVar21,CONCAT18(cVar20,CONCAT17(cVar19,CONCAT16(cVar18,
                                                  CONCAT15(cVar17,CONCAT14(cVar16,CONCAT13(cVar15,
                                                  CONCAT12(cVar14,CONCAT11(cVar13,cVar12))))))))) >>
                                7) & 1) << 6 |
                 (ushort)((byte)(CONCAT18(bVar21,CONCAT17(cVar20,CONCAT16(cVar19,CONCAT15(cVar18,
                                                  CONCAT14(cVar17,CONCAT13(cVar16,CONCAT12(cVar15,
                                                  CONCAT11(cVar14,cVar13)))))))) >> 7) & 1) << 7 |
                (ushort)(bVar21 >> 7) << 0xf) == 0xffff) {
      *local_50 = 0;
      local_34 = FDB_RESULT_SUCCESS;
    }
    else {
      log_callback_00 =
           (err_log_callback *)
           CONCAT17(cStack_79,
                    CONCAT16(cStack_7a,
                             CONCAT15(bStack_7b,
                                      CONCAT14(uStack_7c,
                                               CONCAT13(cStack_7d,
                                                        CONCAT12(cStack_7e,
                                                                 CONCAT11(cStack_7f,cStack_80)))))))
      ;
      dVar22.bodylen_ondisk = (int)in_stack_fffffffffffffef0;
      dVar22.flag = (char)((ulong)in_stack_fffffffffffffef0 >> 0x20);
      dVar22.checksum = (char)((ulong)in_stack_fffffffffffffef0 >> 0x28);
      dVar22.reserved = (short)((ulong)in_stack_fffffffffffffef0 >> 0x30);
      dVar22.keylen = (short)in_stack_fffffffffffffee8;
      dVar22.metalen = (short)((ulong)in_stack_fffffffffffffee8 >> 0x10);
      dVar22.bodylen = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
      local_59 = _docio_length_checksum(dVar22,(docio_handle *)0x10cf0c);
      if (local_59 == bStack_7b) {
        length_00.bodylen_ondisk = (int)in_stack_fffffffffffffee8;
        length_00.flag = (char)((ulong)in_stack_fffffffffffffee8 >> 0x20);
        length_00.checksum = (char)((ulong)in_stack_fffffffffffffee8 >> 0x28);
        length_00.reserved = (short)((ulong)in_stack_fffffffffffffee8 >> 0x30);
        length_00.keylen = 0xd007;
        length_00.metalen = 0x10;
        length_00.bodylen = 0;
        dVar22 = _docio_length_decode(length_00);
        local_c0._0_8_ = dVar22._0_8_;
        local_78.keylen = local_c0.keylen;
        local_78.metalen = local_c0.metalen;
        local_78.bodylen = local_c0.bodylen;
        uVar7 = local_78._0_8_;
        local_c0._8_8_ = dVar22._8_8_;
        local_78.bodylen_ondisk = local_c0.bodylen_ondisk;
        local_78.flag = local_c0.flag;
        local_78.checksum = local_c0.checksum;
        local_78.reserved = local_c0.reserved;
        local_78.keylen = dVar22.keylen;
        local_78._0_8_ = uVar7;
        if ((local_78.keylen == 0) || (0xfff0 < local_78.keylen)) {
          fdb_log_impl(log_callback_01,2,FDB_RESULT_FILE_CORRUPTION,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                       ,"docio_read_doc_key",0x42b,
                       "Error in decoding the doc key length metadata in file %s crc %x keylen %d metalen %d bodylen %d bodylen_ondisk %d offset %lu"
                       ,*(undefined8 *)*local_40,CONCAT44(uVar23,(uint)local_59),
                       CONCAT44(uVar24,(uint)CONCAT11(in_stack_ffffffffffffff79,
                                                      in_stack_ffffffffffffff78)),
                       (uint)CONCAT11(in_stack_ffffffffffffff7b,in_stack_ffffffffffffff7a),
                       CONCAT13(in_stack_ffffffffffffff7f,
                                CONCAT12(in_stack_ffffffffffffff7e,
                                         CONCAT11(in_stack_ffffffffffffff7d,
                                                  in_stack_ffffffffffffff7c))),
                       CONCAT13(cStack_7d,CONCAT12(cStack_7e,CONCAT11(cStack_7f,cStack_80))),
                       local_48);
          local_34 = FDB_RESULT_FILE_CORRUPTION;
        }
        else {
          _local_68 = (fdb_status)
                      _docio_read_doc_component
                                ((docio_handle *)
                                 CONCAT17(in_stack_ffffffffffffff7f,
                                          CONCAT16(in_stack_ffffffffffffff7e,
                                                   CONCAT15(in_stack_ffffffffffffff7d,
                                                            CONCAT14(in_stack_ffffffffffffff7c,
                                                                     CONCAT13(
                                                  in_stack_ffffffffffffff7b,
                                                  CONCAT12(in_stack_ffffffffffffff7a,
                                                           CONCAT11(in_stack_ffffffffffffff79,
                                                                    in_stack_ffffffffffffff78)))))))
                                 ,CONCAT17(in_stack_ffffffffffffff77,
                                           CONCAT16(in_stack_ffffffffffffff76,
                                                    CONCAT15(in_stack_ffffffffffffff75,
                                                             CONCAT14(in_stack_ffffffffffffff74,
                                                                      CONCAT13(
                                                  in_stack_ffffffffffffff73,
                                                  CONCAT12(in_stack_ffffffffffffff72,
                                                           CONCAT11(in_stack_ffffffffffffff71,
                                                                    in_stack_ffffffffffffff70)))))))
                                 ,CONCAT13(in_stack_ffffffffffffff6f,
                                           CONCAT12(in_stack_ffffffffffffff6e,
                                                    CONCAT11(in_stack_ffffffffffffff6d,
                                                             in_stack_ffffffffffffff6c))),
                                 log_callback_01,log_callback_00);
          if ((long)_local_68 < 0) {
            fdb_log_impl(log_callback_01,2,(fdb_status)((ulong)_local_68 & 0xffffffff),
                         "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                         ,"docio_read_doc_key",0x435,
                         "Error in reading a key with offset %lu, length %d from a database file \'%s\'"
                         ,(undefined8)_local_68,CONCAT44(uVar23,(uint)local_78.keylen),
                         *(undefined8 *)*local_40);
            local_34 = (fdb_status)_local_68;
          }
          else {
            *local_50 = local_78.keylen;
            local_34 = FDB_RESULT_SUCCESS;
          }
        }
      }
      else {
        fdb_log_impl(log_callback_01,2,FDB_RESULT_CHECKSUM_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                     ,"docio_read_doc_key",0x420,
                     "doc_length key checksum mismatch error in a database file \'%s\' crc %x != %x (crc in doc) keylen %d metalen %d bodylen %d bodylen_ondisk %d offset %lu"
                     ,*(undefined8 *)*local_40,CONCAT44(uVar23,(uint)local_59),
                     CONCAT44(uVar24,(uint)bStack_7b),
                     (uint)CONCAT11(in_stack_ffffffffffffff79,in_stack_ffffffffffffff78),
                     (uint)CONCAT11(in_stack_ffffffffffffff7b,in_stack_ffffffffffffff7a),
                     CONCAT13(in_stack_ffffffffffffff7f,
                              CONCAT12(in_stack_ffffffffffffff7e,
                                       CONCAT11(in_stack_ffffffffffffff7d,in_stack_ffffffffffffff7c)
                                      )),
                     CONCAT44(uVar25,CONCAT13(cStack_7d,
                                              CONCAT12(cStack_7e,CONCAT11(cStack_7f,cStack_80)))),
                     local_48);
        local_34 = FDB_RESULT_CHECKSUM_ERROR;
      }
    }
  }
  return local_34;
}

Assistant:

fdb_status docio_read_doc_key(struct docio_handle *handle, uint64_t offset,
                              keylen_t *keylen, void *keybuf)
{
    uint8_t checksum;
    int64_t _offset;
    struct docio_length length, _length, zero_length;
    err_log_callback *log_callback = handle->log_callback;

    _offset = _docio_read_length(handle, offset, &_length, log_callback, true);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading the doc length metadata with offset %" _F64 " from "
                "a database file '%s'",
                offset, handle->file->filename);
        return (fdb_status) _offset;
    }

    memset(&zero_length, 0x0, sizeof(struct docio_length));
    if (memcmp(&_length, &zero_length, sizeof(struct docio_length)) == 0) {
        // If all the fields in docio_length are zero, then it means that the rest of
        // the current block, which starts at offset, is zero-filled and can be skipped.
        *keylen = 0;
        return FDB_RESULT_SUCCESS;
    }

    // checksum check
    checksum = _docio_length_checksum(_length, handle);
    if (checksum != _length.checksum) {
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_CHECKSUM_ERROR,
                "doc_length key checksum mismatch error in a database file '%s'"
                " crc %x != %x (crc in doc) keylen %d metalen %d bodylen %d "
                "bodylen_ondisk %d offset %" _F64, handle->file->filename,
                checksum, _length.checksum, _length.keylen, _length.metalen,
                _length.bodylen, _length.bodylen_ondisk, offset);
        return FDB_RESULT_CHECKSUM_ERROR;
    }

    length = _docio_length_decode(_length);
    if (length.keylen == 0 || length.keylen > FDB_MAX_KEYLEN_INTERNAL) {
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_FILE_CORRUPTION,
                "Error in decoding the doc key length metadata in file %s"
                " crc %x keylen %d metalen %d bodylen %d "
                "bodylen_ondisk %d offset %" _F64, handle->file->filename,
                checksum, _length.keylen, _length.metalen,
                _length.bodylen, _length.bodylen_ondisk, offset);
        return FDB_RESULT_FILE_CORRUPTION;
    }

    _offset = _docio_read_doc_component(handle, _offset, length.keylen,
                                        keybuf, log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading a key with offset %" _F64 ", length %d "
                "from a database file '%s'", _offset, length.keylen,
                handle->file->filename);
        return (fdb_status) _offset;
    }

    *keylen = length.keylen;
    return FDB_RESULT_SUCCESS;
}